

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3ExprGlobalHitsCb(Fts3Expr *pExpr,int iPhrase,void *pCtx)

{
  u8 uVar1;
  u8 uVar2;
  undefined4 uVar3;
  Fts3Cursor *pCsr;
  sqlite3_vtab *psVar4;
  int iVar5;
  Fts3Expr *pExpr_00;
  u32 *puVar6;
  undefined4 *puVar7;
  long lVar8;
  Fts3Expr *pFVar9;
  long lVar10;
  Fts3Expr *pFVar11;
  Fts3Table *pTab;
  int local_54;
  sqlite3_int64 local_50;
  long local_48;
  long local_40;
  sqlite3_int64 local_38;
  
  pCsr = *pCtx;
  local_40 = *(long *)((long)pCtx + 0x18);
  local_48 = (long)(iPhrase * *(int *)((long)pCtx + 8) * 3);
  psVar4 = (pCsr->base).pVtab;
  if ((pExpr->bDeferred == '\0') || (pExpr->pParent->eType == 1)) {
    local_54 = 0;
    if (pExpr->aMI == (u32 *)0x0) {
      local_50 = pCsr->iPrevId;
      pFVar11 = pExpr;
      do {
        pExpr_00 = pFVar11;
        pFVar11 = pExpr_00->pParent;
        if (pFVar11 == (Fts3Expr *)0x0) break;
      } while (pFVar11->eType == 1);
      local_38 = pExpr_00->iDocid;
      uVar1 = pExpr_00->bEof;
      for (pFVar11 = pExpr_00; pFVar11 != (Fts3Expr *)0x0; pFVar11 = pFVar11->pLeft) {
        pFVar9 = pFVar11;
        if (pFVar11->eType != 5) {
          pFVar9 = pFVar11->pRight;
        }
        puVar6 = (u32 *)sqlite3_malloc(*(int *)&psVar4[2].pModule * 0xc);
        pFVar9->aMI = puVar6;
        if (puVar6 == (u32 *)0x0) {
          return 7;
        }
        memset(puVar6,0,(long)*(int *)&psVar4[2].pModule * 0xc);
      }
      fts3EvalRestart(pCsr,pExpr_00,&local_54);
      while ((pCsr->isEof == '\0' && (local_54 == 0))) {
        do {
          if (pCsr->isRequireSeek == '\0') {
            sqlite3_reset(pCsr->pStmt);
          }
          fts3EvalNextRow(pCsr,pExpr_00,&local_54);
          uVar2 = pExpr_00->bEof;
          pCsr->isEof = uVar2;
          pCsr->isRequireSeek = '\x01';
          pCsr->isMatchinfoNeeded = 1;
          pCsr->iPrevId = pExpr_00->iDocid;
        } while (((uVar2 == '\0') && (pExpr_00->eType == 1)) &&
                (iVar5 = fts3EvalTestDeferredAndNear(pCsr,&local_54), iVar5 != 0));
        if ((local_54 == 0) && (pCsr->isEof == '\0')) {
          fts3EvalUpdateCounts(pExpr_00);
        }
      }
      pCsr->isEof = '\0';
      pCsr->iPrevId = local_50;
      if (uVar1 == '\0') {
        fts3EvalRestart(pCsr,pExpr_00,&local_54);
        do {
          fts3EvalNextRow(pCsr,pExpr_00,&local_54);
          if (pExpr_00->iDocid == local_38) break;
        } while (local_54 == 0);
        fts3EvalTestDeferredAndNear(pCsr,&local_54);
      }
      else {
        pExpr_00->bEof = uVar1;
      }
      if (local_54 != 0) {
        return local_54;
      }
    }
    local_40 = local_40 + local_48 * 4;
    lVar8 = 8;
    for (lVar10 = 0; lVar10 < *(int *)&psVar4[2].pModule; lVar10 = lVar10 + 1) {
      puVar6 = pExpr->aMI;
      *(undefined4 *)(local_40 + -4 + lVar8) = *(undefined4 *)((long)puVar6 + lVar8 + -4);
      *(undefined4 *)(local_40 + lVar8) = *(undefined4 *)((long)puVar6 + lVar8);
      lVar8 = lVar8 + 0xc;
    }
  }
  else {
    puVar7 = (undefined4 *)(local_40 + local_48 * 4 + 8);
    for (lVar8 = 0; lVar8 < *(int *)&psVar4[2].pModule; lVar8 = lVar8 + 1) {
      uVar3 = (undefined4)pCsr->nDoc;
      puVar7[-1] = uVar3;
      *puVar7 = uVar3;
      puVar7 = puVar7 + 3;
    }
  }
  return 0;
}

Assistant:

static int fts3ExprGlobalHitsCb(
  Fts3Expr *pExpr,                /* Phrase expression node */
  int iPhrase,                    /* Phrase number (numbered from zero) */
  void *pCtx                      /* Pointer to MatchInfo structure */
){
  MatchInfo *p = (MatchInfo *)pCtx;
  return sqlite3Fts3EvalPhraseStats(
      p->pCursor, pExpr, &p->aMatchinfo[3*iPhrase*p->nCol]
  );
}